

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O3

void __thiscall
aeron::ClientConductor::releaseSubscription
          (ClientConductor *this,int64_t registrationId,ImageList *imageList)

{
  pointer pSVar1;
  Image *pIVar2;
  int iVar3;
  longlong now;
  pointer pSVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  iterator __position;
  
  verifyDriverIsActiveViaErrorHandler(this);
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->m_adminLock);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  pSVar4 = (this->m_subscriptions).
           super__Vector_base<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (this->m_subscriptions).
           super__Vector_base<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar7 = (long)pSVar1 - (long)pSVar4;
  lVar6 = (lVar7 >> 6) * -0x5555555555555555 >> 2;
  if (0 < lVar6) {
    lVar7 = lVar6 + 1;
    __position._M_current = pSVar4 + 2;
    do {
      if (__position._M_current[-2].m_registrationId == registrationId) {
        __position._M_current = __position._M_current + -2;
        goto LAB_0013fd86;
      }
      if (__position._M_current[-1].m_registrationId == registrationId) {
        __position._M_current = __position._M_current + -1;
        goto LAB_0013fd86;
      }
      if ((__position._M_current)->m_registrationId == registrationId) goto LAB_0013fd86;
      if (__position._M_current[1].m_registrationId == registrationId) {
        __position._M_current = __position._M_current + 1;
        goto LAB_0013fd86;
      }
      lVar7 = lVar7 + -1;
      __position._M_current = __position._M_current + 4;
    } while (1 < lVar7);
    lVar7 = (long)pSVar1 - (long)(pSVar4 + lVar6 * 4);
    pSVar4 = pSVar4 + lVar6 * 4;
  }
  lVar6 = (lVar7 >> 6) * -0x5555555555555555;
  if (lVar6 == 1) {
LAB_0013fd60:
    __position._M_current = pSVar4;
    if (pSVar4->m_registrationId != registrationId) {
      __position._M_current = pSVar1;
    }
LAB_0013fd86:
    if (__position._M_current != pSVar1) {
      DriverProxy::removeSubscription(this->m_driverProxy,(__position._M_current)->m_registrationId)
      ;
      if (imageList->m_length != 0) {
        lVar6 = 0;
        uVar5 = 0;
        do {
          if (((__position._M_current)->m_onUnavailableImageHandler).super__Function_base._M_manager
              == (_Manager_type)0x0) {
            std::__throw_bad_function_call();
          }
          (*((__position._M_current)->m_onUnavailableImageHandler)._M_invoker)
                    ((_Any_data *)&(__position._M_current)->m_onUnavailableImageHandler,
                     (Image *)((long)(imageList->m_images->m_termBuffers)._M_elems + lVar6 + -8));
          uVar5 = uVar5 + 1;
          lVar6 = lVar6 + 0x128;
        } while (uVar5 < imageList->m_length);
      }
      std::
      vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
      ::_M_erase(&this->m_subscriptions,__position);
      if ((this->m_epochClock).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      now = (*(this->m_epochClock)._M_invoker)((_Any_data *)&this->m_epochClock);
      lingerAllResources(this,now,imageList);
      goto LAB_0013fe6d;
    }
  }
  else {
    if (lVar6 == 2) {
LAB_0013fd53:
      __position._M_current = pSVar4;
      if (pSVar4->m_registrationId != registrationId) {
        pSVar4 = pSVar4 + 1;
        goto LAB_0013fd60;
      }
      goto LAB_0013fd86;
    }
    if (lVar6 == 3) {
      __position._M_current = pSVar4;
      if (pSVar4->m_registrationId != registrationId) {
        pSVar4 = pSVar4 + 1;
        goto LAB_0013fd53;
      }
      goto LAB_0013fd86;
    }
  }
  if (imageList != (ImageList *)0x0) {
    pIVar2 = imageList->m_images;
    if (pIVar2 != (Image *)0x0) {
      if (*(long *)&pIVar2[-1].m_positionBitsToShift != 0) {
        lVar6 = *(long *)&pIVar2[-1].m_positionBitsToShift * 0x128;
        do {
          Image::~Image((Image *)((long)pIVar2[-1].m_termBuffers._M_elems + lVar6 + -8));
          lVar6 = lVar6 + -0x128;
        } while (lVar6 != 0);
      }
      operator_delete__(&pIVar2[-1].m_positionBitsToShift);
    }
    operator_delete(imageList);
  }
LAB_0013fe6d:
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_adminLock);
  return;
}

Assistant:

void ClientConductor::releaseSubscription(std::int64_t registrationId, struct ImageList *imageList)
{
    verifyDriverIsActiveViaErrorHandler();

    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    auto it = std::find_if(m_subscriptions.begin(), m_subscriptions.end(),
        [registrationId](const SubscriptionStateDefn &entry)
        {
            return registrationId == entry.m_registrationId;
        });

    if (it != m_subscriptions.end())
    {
        m_driverProxy.removeSubscription((*it).m_registrationId);

        for (std::size_t i = 0; i < imageList->m_length; i++)
        {
            (*it).m_onUnavailableImageHandler(imageList->m_images[i]);
        }

        m_subscriptions.erase(it);

        lingerAllResources(m_epochClock(), imageList);
    }
    else if (nullptr != imageList)
    {
        delete[] imageList->m_images;
        delete imageList;
    }
}